

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wedge_utils_avx2.c
# Opt level: O0

int8_t av1_wedge_sign_from_residuals_avx2(int16_t *ds,uint8_t *m,int N,int64_t limit)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  long in_RCX;
  int in_EDX;
  undefined1 (*in_RSI) [32];
  undefined1 (*in_RDI) [32];
  undefined1 auVar10 [32];
  __m128i v_acc_q_1;
  __m128i v_acc_q_0;
  __m256i v_acc_q;
  __m256i v_sign_d;
  __m256i v_p0123_d;
  __m256i v_p23_d;
  __m256i v_p01_d;
  __m256i v_p3_d;
  __m256i v_p2_d;
  __m256i v_p1_d;
  __m256i v_p0_d;
  __m256i v_m3_w;
  __m256i v_m2_w;
  __m256i v_m1_w;
  __m256i v_m0_w;
  __m256i v_d3_w;
  __m256i v_d2_w;
  __m256i v_d1_w;
  __m256i v_d0_w;
  __m256i v_m23_b;
  __m256i v_m01_b;
  __m256i v_acc0_d;
  int64_t acc;
  undefined8 local_780;
  undefined8 uStack_778;
  long local_770;
  undefined1 auStack_750 [16];
  undefined1 local_500 [32];
  int local_4b4;
  undefined1 (*local_4b0) [32];
  undefined1 (*local_4a8) [32];
  undefined1 local_420 [16];
  
  local_500 = ZEXT1632(ZEXT816(0));
  local_4b4 = in_EDX;
  local_4b0 = in_RSI;
  local_4a8 = in_RDI;
  do {
    auVar1 = vlddqu_avx(*local_4b0);
    auVar10 = vlddqu_avx(local_4b0[1]);
    auVar2 = vlddqu_avx(*local_4a8);
    auVar3 = vlddqu_avx(local_4a8[1]);
    auVar4 = vlddqu_avx(local_4a8[2]);
    auVar5 = vlddqu_avx(local_4a8[3]);
    auVar1 = vpmovzxbw_avx2(auVar1._0_16_);
    auVar7 = vpmovzxbw_avx2(local_420);
    auVar8 = vpmovzxbw_avx2(auVar10._0_16_);
    auVar9 = vpmovzxbw_avx2(auVar10._16_16_);
    auVar1 = vpmaddwd_avx2(auVar2,auVar1);
    auVar10 = vpmaddwd_avx2(auVar3,auVar7);
    auVar2 = vpmaddwd_avx2(auVar4,auVar8);
    auVar3 = vpmaddwd_avx2(auVar5,auVar9);
    auVar1 = vpaddd_avx2(auVar1,auVar10);
    auVar10 = vpaddd_avx2(auVar2,auVar3);
    auVar1 = vpaddd_avx2(auVar1,auVar10);
    local_500 = vpaddd_avx2(local_500,auVar1);
    local_4a8 = local_4a8 + 4;
    local_4b0 = local_4b0 + 2;
    local_4b4 = local_4b4 + -0x40;
  } while (local_4b4 != 0);
  auVar1 = vpsrad_avx2(local_500,ZEXT416(0x1f));
  auVar10 = vpunpckldq_avx2(local_500,auVar1);
  auVar1 = vpunpckhdq_avx2(local_500,auVar1);
  auVar1 = vpaddq_avx2(auVar10,auVar1);
  auVar10 = vpsrldq_avx2(auVar1,8);
  auVar1 = vpaddq_avx2(auVar1,auVar10);
  auStack_750 = auVar1._16_16_;
  auVar6._8_8_ = uStack_778;
  auVar6._0_8_ = local_780;
  auVar6 = vpaddq_avx(auStack_750,auVar6);
  local_770 = auVar6._0_8_;
  return in_RCX < local_770;
}

Assistant:

int8_t av1_wedge_sign_from_residuals_avx2(const int16_t *ds, const uint8_t *m,
                                          int N, int64_t limit) {
  int64_t acc;
  __m256i v_acc0_d = _mm256_setzero_si256();

  // Input size limited to 8192 by the use of 32 bit accumulators and m
  // being between [0, 64]. Overflow might happen at larger sizes,
  // though it is practically impossible on real video input.
  assert(N < 8192);
  assert(N % 64 == 0);

  do {
    const __m256i v_m01_b = _mm256_lddqu_si256((__m256i *)(m));
    const __m256i v_m23_b = _mm256_lddqu_si256((__m256i *)(m + 32));

    const __m256i v_d0_w = _mm256_lddqu_si256((__m256i *)(ds));
    const __m256i v_d1_w = _mm256_lddqu_si256((__m256i *)(ds + 16));
    const __m256i v_d2_w = _mm256_lddqu_si256((__m256i *)(ds + 32));
    const __m256i v_d3_w = _mm256_lddqu_si256((__m256i *)(ds + 48));

    const __m256i v_m0_w =
        _mm256_cvtepu8_epi16(_mm256_castsi256_si128(v_m01_b));
    const __m256i v_m1_w =
        _mm256_cvtepu8_epi16(_mm256_extracti128_si256(v_m01_b, 1));
    const __m256i v_m2_w =
        _mm256_cvtepu8_epi16(_mm256_castsi256_si128(v_m23_b));
    const __m256i v_m3_w =
        _mm256_cvtepu8_epi16(_mm256_extracti128_si256(v_m23_b, 1));

    const __m256i v_p0_d = _mm256_madd_epi16(v_d0_w, v_m0_w);
    const __m256i v_p1_d = _mm256_madd_epi16(v_d1_w, v_m1_w);
    const __m256i v_p2_d = _mm256_madd_epi16(v_d2_w, v_m2_w);
    const __m256i v_p3_d = _mm256_madd_epi16(v_d3_w, v_m3_w);

    const __m256i v_p01_d = _mm256_add_epi32(v_p0_d, v_p1_d);
    const __m256i v_p23_d = _mm256_add_epi32(v_p2_d, v_p3_d);

    const __m256i v_p0123_d = _mm256_add_epi32(v_p01_d, v_p23_d);

    v_acc0_d = _mm256_add_epi32(v_acc0_d, v_p0123_d);

    ds += 64;
    m += 64;

    N -= 64;
  } while (N);

  __m256i v_sign_d = _mm256_srai_epi32(v_acc0_d, 31);
  v_acc0_d = _mm256_add_epi64(_mm256_unpacklo_epi32(v_acc0_d, v_sign_d),
                              _mm256_unpackhi_epi32(v_acc0_d, v_sign_d));

  __m256i v_acc_q = _mm256_add_epi64(v_acc0_d, _mm256_srli_si256(v_acc0_d, 8));

  __m128i v_acc_q_0 = _mm256_castsi256_si128(v_acc_q);
  __m128i v_acc_q_1 = _mm256_extracti128_si256(v_acc_q, 1);
  v_acc_q_0 = _mm_add_epi64(v_acc_q_0, v_acc_q_1);

#if AOM_ARCH_X86_64
  acc = _mm_extract_epi64(v_acc_q_0, 0);
#else
  xx_storel_64(&acc, v_acc_q_0);
#endif

  return acc > limit;
}